

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

Vec_Int_t * Gia_ManCollectPoIds(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *p_00;
  int *piVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  Vec_Int_t *pVVar8;
  
  iVar1 = p->nRegs;
  pVVar8 = p->vCos;
  uVar2 = pVVar8->nSize;
  uVar5 = (ulong)uVar2;
  iVar7 = uVar2 - iVar1;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar7 - 1U) {
    iVar4 = iVar7;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar4;
  if (iVar4 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)iVar4 << 2);
  }
  p_00->pArray = piVar3;
  if (iVar1 < (int)uVar2) {
    lVar6 = 0;
    do {
      if ((int)uVar5 <= lVar6) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      Vec_IntPush(p_00,pVVar8->pArray[lVar6]);
      lVar6 = lVar6 + 1;
      pVVar8 = p->vCos;
      uVar5 = (ulong)pVVar8->nSize;
    } while (lVar6 < (long)(uVar5 - (long)p->nRegs));
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManCollectPoIds( Gia_Man_t * p )
{
    Vec_Int_t * vStart;
    int Entry, i;
    vStart = Vec_IntAlloc( Gia_ManPoNum(p) );
    Vec_IntForEachEntryStop( p->vCos, Entry, i, Gia_ManPoNum(p) )
        Vec_IntPush( vStart, Entry );
    return vStart;
}